

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall brynet::net::EventLoop::reallocEventSize(EventLoop *this,size_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  epoll_event *peVar3;
  size_t size_local;
  EventLoop *this_local;
  
  if (this->mEventEntries != (epoll_event *)0x0) {
    if (this->mEventEntries != (epoll_event *)0x0) {
      operator_delete__(this->mEventEntries);
    }
    this->mEventEntries = (epoll_event *)0x0;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  peVar3 = (epoll_event *)operator_new__(uVar2);
  this->mEventEntries = peVar3;
  this->mEventEntriesNum = size;
  return;
}

Assistant:

void EventLoop::reallocEventSize(size_t size)
{
    if (mEventEntries != nullptr)
    {
        delete[] mEventEntries;
        mEventEntries = nullptr;
    }

#ifdef PLATFORM_WINDOWS
    mEventEntries = new OVERLAPPED_ENTRY[size];
#else
    mEventEntries = new epoll_event[size];
#endif

    mEventEntriesNum = size;
}